

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

size_t __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::findIdx<std::__cxx11::string>
          (Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  byte *pbVar1;
  __type _Var2;
  long lVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  InfoType info;
  size_t idx;
  
  idx = 0;
  info = 0;
  keyToIdx<std::__cxx11::string_const&>(this,key,&idx,&info);
  lVar3 = *(long *)(this + 8);
  uVar5 = (uint)*(byte *)(lVar3 + idx);
  do {
    if (info == uVar5) {
      _Var2 = std::operator==(key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(idx * 0x28 + *(long *)this));
      if (_Var2) {
        return idx;
      }
      lVar3 = *(long *)(this + 8);
    }
    sVar4 = idx + 1;
    iVar6 = *(int *)(this + 0x28);
    info = info + iVar6;
    pbVar1 = (byte *)(lVar3 + 1 + idx);
    idx = sVar4;
    if (info == *pbVar1) {
      _Var2 = std::operator==(key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(sVar4 * 0x28 + *(long *)this));
      if (_Var2) {
        return idx;
      }
      iVar6 = *(int *)(this + 0x28);
      lVar3 = *(long *)(this + 8);
    }
    info = info + iVar6;
    uVar5 = (uint)*(byte *)(lVar3 + 1 + idx);
    idx = idx + 1;
  } while (info <= uVar5);
  if (*(long *)(this + 0x18) == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = (lVar3 - *(long *)this) / 0x28;
  }
  return sVar4;
}

Assistant:

size_t findIdx(Other const& key) const {
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        do {
            // unrolling this twice gives a bit of a speedup. More unrolling did not help.
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found!
        return mMask == 0 ? 0
                          : static_cast<size_t>(std::distance(
                                mKeyVals, reinterpret_cast_no_cast_align_warning<Node*>(mInfo)));
    }